

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterSystem.cpp
# Opt level: O0

void __thiscall
Sega::MasterSystem::ConcreteMachine<(Analyser::Static::Sega::Target::Model)2>::
keyboard_did_change_key(ConcreteMachine<(Analyser::Static::Sega::Target::Model)2> *this)

{
  byte in_CL;
  Key in_EDX;
  Keyboard *in_RSI;
  
  keyboard_did_change_key
            ((ConcreteMachine<(Analyser::Static::Sega::Target::Model)2> *)
             (this[-1].write_pointers_ + 0x37),in_RSI,in_EDX,(bool)(in_CL & 1));
  return;
}

Assistant:

bool keyboard_did_change_key(Inputs::Keyboard *, Inputs::Keyboard::Key key, bool is_pressed) final {
			if(key == Inputs::Keyboard::Key::Enter) {
				pause_is_pressed_ = is_pressed;
				return true;
			}

			if(key == Inputs::Keyboard::Key::Escape) {
				reset_is_pressed_ = is_pressed;
				return true;
			}

			return false;
		}